

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O3

vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> * __thiscall
hiberlite::Database::getAllBeans<Person>
          (vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
           *__return_storage_ptr__,Database *this)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  pointer plVar3;
  long lVar4;
  size_type __n;
  vector<long_long,_std::allocator<long_long>_> ids;
  bean_key local_78;
  bean_ptr<Person> local_60;
  vector<long_long,_std::allocator<long_long>_> local_48;
  
  getBeanIds<Person>(&local_48,this);
  plVar3 = local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::reserve
            (__return_storage_ptr__,__n);
  if (local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar3) {
    lVar4 = 0;
    do {
      local_78.id = local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
      psVar2 = (this->con).res;
      if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        local_78.con.res = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0;
      }
      else {
        psVar2->refCount = psVar2->refCount + 2;
        local_78.con.res = psVar2;
      }
      local_78.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      Registry<Person>::get(&local_60,&local_78);
      local_78.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      if (local_78.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_78.con.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_78.con.res)->_vptr_shared_cnt_obj_pair[1])();
        }
      }
      if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &psVar2->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
        }
      }
      std::vector<hiberlite::bean_ptr<Person>,std::allocator<hiberlite::bean_ptr<Person>>>::
      emplace_back<hiberlite::bean_ptr<Person>>
                ((vector<hiberlite::bean_ptr<Person>,std::allocator<hiberlite::bean_ptr<Person>>> *)
                 __return_storage_ptr__,&local_60);
      local_60.super_shared_res<hiberlite::real_bean<Person>_>._vptr_shared_res =
           (_func_int **)&PTR__shared_res_001996f8;
      if (local_60.super_shared_res<hiberlite::real_bean<Person>_>.res !=
          (shared_cnt_obj_pair<hiberlite::real_bean<Person>_> *)0x0) {
        piVar1 = &(local_60.super_shared_res<hiberlite::real_bean<Person>_>.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_60.super_shared_res<hiberlite::real_bean<Person>_>.res)->
            _vptr_shared_cnt_obj_pair[1])();
        }
      }
      lVar4 = lVar4 + 1;
    } while (__n + (__n == 0) != lVar4);
  }
  if (local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< bean_ptr<C> > Database::getAllBeans()
{
	std::vector<sqlid_t> ids=getBeanIds<C>();
	size_t N=ids.size();
	std::vector< bean_ptr<C> > ans;
	ans.reserve(N);
	for(size_t i=0;i<N;i++)
		ans.push_back( loadBean<C>(ids[i]) );
	return ans;
}